

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::inject_assertion_fail(Generator *top)

{
  undefined1 local_58 [8];
  AssertionVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  AssertionVisitor::AssertionVisitor((AssertionVisitor *)local_58);
  IRVisitor::visit_root
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  AssertionVisitor::~AssertionVisitor((AssertionVisitor *)local_58);
  return;
}

Assistant:

void inject_assertion_fail(Generator *top) {
    AssertionVisitor visitor;
    visitor.visit_root(top);
}